

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void hgdb::json::SymbolTable::walk_up<false>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  ScopeBase *pSVar1;
  uint64_t uVar2;
  bool bVar3;
  
  do {
    pSVar1 = scope->parent;
    if (pSVar1 == (ScopeBase *)0x0) {
      return;
    }
    uVar2 = scope->index_;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, scope = pSVar1, bVar3) {
      bVar3 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()
                        (terminate,
                         (ScopeBase *)
                         (pSVar1->scopes_).
                         super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                         super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
                         ._M_t);
      if (bVar3) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }